

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string_sprintf.c
# Opt level: O2

void archive_string_vsprintf(archive_string *as,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  wchar_t wVar4;
  archive_string *paVar5;
  ulong *puVar6;
  uint *puVar7;
  char *pcVar8;
  long *plVar9;
  size_t len;
  int *piVar10;
  byte bVar11;
  char cVar12;
  wchar_t *__s;
  ulong uVar13;
  char *pcVar14;
  
  paVar5 = archive_string_ensure(as,0x40);
  if (paVar5 == (archive_string *)0x0) {
LAB_00108c27:
    __archive_errx(1,"Out of memory");
  }
  if (fmt == (char *)0x0) {
    *as->s = '\0';
    return;
  }
LAB_00108949:
  cVar12 = *fmt;
  if (cVar12 == '%') {
    pcVar14 = fmt + 1;
    bVar1 = fmt[1];
    bVar11 = bVar1;
    bVar3 = 0;
    if ((bVar1 - 0x6a < 0x11) && (bVar3 = 0, (0x10005U >> (bVar1 - 0x6a & 0x1f) & 1) != 0)) {
      pcVar14 = fmt + 2;
      bVar11 = fmt[2];
      bVar3 = bVar1;
    }
    switch(bVar11) {
    case 0x6f:
    case 0x75:
    case 0x78:
switchD_001089d6_caseD_6f:
      uVar2 = ap->gp_offset;
      uVar13 = (ulong)uVar2;
      if (bVar3 == 0x7a) {
        if (uVar2 < 0x29) {
          puVar6 = (ulong *)((long)ap->reg_save_area + uVar13);
          ap->gp_offset = uVar2 + 8;
        }
        else {
LAB_00108a3f:
          puVar6 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar6 + 1;
        }
LAB_00108a4b:
        uVar13 = *puVar6;
      }
      else {
        if ((bVar3 == 0x6c) || (bVar3 == 0x6a)) {
          if (0x28 < uVar2) goto LAB_00108a3f;
          puVar6 = (ulong *)((long)ap->reg_save_area + uVar13);
          ap->gp_offset = uVar2 + 8;
          goto LAB_00108a4b;
        }
        if (uVar2 < 0x29) {
          puVar7 = (uint *)(uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          puVar7 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar7 + 2;
        }
        uVar13 = (ulong)*puVar7;
      }
      if (*pcVar14 == 'u') goto LAB_00108bff;
      if (*pcVar14 == 'o') {
        uVar2 = 8;
      }
      else {
        uVar2 = 0x10;
      }
      break;
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_001089d6_caseD_70:
      cVar12 = '%';
      goto LAB_00108961;
    case 0x73:
      uVar2 = ap->gp_offset;
      uVar13 = (ulong)uVar2;
      if (bVar3 == 0x6c) {
        if (uVar2 < 0x29) {
LAB_00108ac9:
          plVar9 = (long *)(uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = (int)uVar13 + 8;
        }
        else {
LAB_00108a1b:
          plVar9 = (long *)ap->overflow_arg_area;
          ap->overflow_arg_area = plVar9 + 1;
        }
        __s = anon_var_dwarf_1a2ae;
        if ((wchar_t *)*plVar9 != (wchar_t *)0x0) {
          __s = (wchar_t *)*plVar9;
        }
        len = wcslen(__s);
        wVar4 = archive_string_append_from_wcs(as,__s,len);
        if ((wVar4 == L'\0') || (piVar10 = __errno_location(), *piVar10 != 0xc)) goto LAB_00108c07;
        goto LAB_00108c27;
      }
      if (uVar2 < 0x29) {
        plVar9 = (long *)(uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        plVar9 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = plVar9 + 1;
      }
      pcVar8 = "(null)";
      if ((char *)*plVar9 != (char *)0x0) {
        pcVar8 = (char *)*plVar9;
      }
      archive_strcat(as,pcVar8);
      goto LAB_00108c07;
    default:
      if (bVar11 != 100) {
        if (bVar11 == 0x53) {
          uVar13 = (ulong)ap->gp_offset;
          if (0x28 < uVar13) goto LAB_00108a1b;
          goto LAB_00108ac9;
        }
        if (bVar11 != 0x58) {
          if (bVar11 == 99) {
            uVar2 = ap->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              pcVar8 = (char *)((ulong)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              pcVar8 = (char *)ap->overflow_arg_area;
              ap->overflow_arg_area = pcVar8 + 8;
            }
            cVar12 = *pcVar8;
          }
          else {
            if (bVar11 != 0x25) goto switchD_001089d6_caseD_70;
            cVar12 = '%';
          }
          archive_strappend_char(as,cVar12);
          goto LAB_00108c07;
        }
        goto switchD_001089d6_caseD_6f;
      }
      uVar2 = ap->gp_offset;
      uVar13 = (ulong)uVar2;
      if (bVar3 == 0x7a) {
        if (uVar2 < 0x29) {
          puVar6 = (ulong *)((long)ap->reg_save_area + uVar13);
          ap->gp_offset = uVar2 + 8;
        }
        else {
LAB_00108bb3:
          puVar6 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar6 + 1;
        }
LAB_00108bbf:
        uVar13 = *puVar6;
      }
      else {
        if ((bVar3 == 0x6c) || (bVar3 == 0x6a)) {
          if (0x28 < uVar2) goto LAB_00108bb3;
          puVar6 = (ulong *)((long)ap->reg_save_area + uVar13);
          ap->gp_offset = uVar2 + 8;
          goto LAB_00108bbf;
        }
        if (uVar2 < 0x29) {
          piVar10 = (int *)(uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          piVar10 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar10 + 2;
        }
        uVar13 = (ulong)*piVar10;
      }
      if ((long)uVar13 < 0) {
        archive_strappend_char(as,'-');
        uVar13 = -uVar13;
      }
LAB_00108bff:
      uVar2 = 10;
    }
    append_uint(as,uVar13,uVar2);
  }
  else {
    if (cVar12 == '\0') {
      return;
    }
LAB_00108961:
    archive_strappend_char(as,cVar12);
    pcVar14 = fmt;
  }
LAB_00108c07:
  fmt = pcVar14 + 1;
  goto LAB_00108949;
}

Assistant:

void
archive_string_vsprintf(struct archive_string *as, const char *fmt,
    va_list ap)
{
	char long_flag;
	intmax_t s; /* Signed integer temp. */
	uintmax_t u; /* Unsigned integer temp. */
	const char *p, *p2;
	const wchar_t *pw;

	if (archive_string_ensure(as, 64) == NULL)
		__archive_errx(1, "Out of memory");

	if (fmt == NULL) {
		as->s[0] = 0;
		return;
	}

	for (p = fmt; *p != '\0'; p++) {
		const char *saved_p = p;

		if (*p != '%') {
			archive_strappend_char(as, *p);
			continue;
		}

		p++;

		long_flag = '\0';
		switch(*p) {
		case 'j':
		case 'l':
		case 'z':
			long_flag = *p;
			p++;
			break;
		}

		switch (*p) {
		case '%':
			archive_strappend_char(as, '%');
			break;
		case 'c':
			s = va_arg(ap, int);
			archive_strappend_char(as, (char)s);
			break;
		case 'd':
			switch(long_flag) {
			case 'j': s = va_arg(ap, intmax_t); break;
			case 'l': s = va_arg(ap, long); break;
			case 'z': s = va_arg(ap, ssize_t); break;
			default:  s = va_arg(ap, int); break;
			}
		        append_int(as, s, 10);
			break;
		case 's':
			switch(long_flag) {
			case 'l':
				pw = va_arg(ap, wchar_t *);
				if (pw == NULL)
					pw = L"(null)";
				if (archive_string_append_from_wcs(as, pw,
				    wcslen(pw)) != 0 && errno == ENOMEM)
					__archive_errx(1, "Out of memory");
				break;
			default:
				p2 = va_arg(ap, char *);
				if (p2 == NULL)
					p2 = "(null)";
				archive_strcat(as, p2);
				break;
			}
			break;
		case 'S':
			pw = va_arg(ap, wchar_t *);
			if (pw == NULL)
				pw = L"(null)";
			if (archive_string_append_from_wcs(as, pw,
			    wcslen(pw)) != 0 && errno == ENOMEM)
				__archive_errx(1, "Out of memory");
			break;
		case 'o': case 'u': case 'x': case 'X':
			/* Common handling for unsigned integer formats. */
			switch(long_flag) {
			case 'j': u = va_arg(ap, uintmax_t); break;
			case 'l': u = va_arg(ap, unsigned long); break;
			case 'z': u = va_arg(ap, size_t); break;
			default:  u = va_arg(ap, unsigned int); break;
			}
			/* Format it in the correct base. */
			switch (*p) {
			case 'o': append_uint(as, u, 8); break;
			case 'u': append_uint(as, u, 10); break;
			default: append_uint(as, u, 16); break;
			}
			break;
		default:
			/* Rewind and print the initial '%' literally. */
			p = saved_p;
			archive_strappend_char(as, *p);
		}
	}
}